

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void handle_cgi(mg_connection *nc,char *prog,http_message *hm,mg_serve_http_opts *opts)

{
  byte bVar1;
  size_t sVar2;
  size_t sVar3;
  mg_add_sock_opts opts_00;
  mg_serve_http_opts *pmVar4;
  mg_connection *nc_00;
  __pid_t _Var5;
  socklen_t *buf_00;
  char *pcVar6;
  mg_str *pmVar7;
  byte *pbVar8;
  __int32_t **pp_Var9;
  long lVar10;
  char *pcVar11;
  void *pvVar12;
  mg_connection *nc_01;
  int *piVar13;
  size_t __n;
  ulong uVar14;
  size_t sVar15;
  ulong uVar16;
  char *pcVar17;
  sock_t fds [2];
  char buf [100];
  char dir [500];
  cgi_env_block blk;
  int local_2660;
  int local_265c;
  char *local_2658;
  mg_serve_http_opts *local_2650;
  mg_connection *local_2648;
  char *local_2640;
  socklen_t local_2638 [128];
  socket_address local_2438 [31];
  cgi_env_block local_2240;
  
  local_2240.len = 0;
  local_2240.nvars = 0;
  local_2240.nc = nc;
  buf_00 = (socklen_t *)getenv("SERVER_NAME");
  if (buf_00 == (socklen_t *)0x0) {
    local_2638[0] = 8;
    local_2438[0]._0_8_ = 0;
    local_2438[0]._8_1_ = '\0';
    local_2438[0]._9_1_ = '\0';
    local_2438[0]._10_1_ = '\0';
    local_2438[0]._11_1_ = '\0';
    local_2438[0]._12_1_ = '\0';
    local_2438[0]._13_1_ = '\0';
    local_2438[0]._14_1_ = '\0';
    local_2438[0]._15_1_ = '\0';
    getsockname(nc->sock,(sockaddr *)&local_2438[0].sa,local_2638);
    buf_00 = local_2638;
    mg_sock_addr_to_str(local_2438,(char *)buf_00,100,3);
  }
  addenv(&local_2240,"SERVER_NAME=%s",buf_00);
  addenv(&local_2240,"SERVER_ROOT=%s",opts->document_root);
  addenv(&local_2240,"DOCUMENT_ROOT=%s",opts->document_root);
  addenv(&local_2240,"SERVER_SOFTWARE=%s/%s","Mongoose","6.2");
  addenv(&local_2240,"%s","GATEWAY_INTERFACE=CGI/1.1");
  addenv(&local_2240,"%s","SERVER_PROTOCOL=HTTP/1.1");
  addenv(&local_2240,"%s","REDIRECT_STATUS=200");
  addenv(&local_2240,"REQUEST_METHOD=%.*s",(ulong)(uint)(hm->method).len,(hm->method).p);
  sVar15 = (hm->query_string).len;
  pcVar17 = "?";
  local_2658 = "";
  if (sVar15 == 0) {
    pcVar17 = "";
  }
  addenv(&local_2240,"REQUEST_URI=%.*s%s%.*s",(ulong)(uint)(hm->uri).len,(hm->uri).p,pcVar17,sVar15,
         (hm->query_string).p);
  pcVar6 = strrchr(prog,0x2f);
  pcVar11 = (hm->uri).p;
  sVar15 = (hm->uri).len;
  pcVar17 = pcVar11 + sVar15;
  if (0 < (long)sVar15) {
    do {
      if (*pcVar17 == '/') break;
      pcVar17 = pcVar17 + -1;
    } while (pcVar11 < pcVar17);
  }
  if (pcVar6 == (char *)0x0) {
    pcVar6 = prog;
  }
  addenv(&local_2240,"SCRIPT_NAME=%.*s%s",(ulong)(uint)((int)pcVar17 - (int)pcVar11),pcVar11,pcVar6)
  ;
  addenv(&local_2240,"SCRIPT_FILENAME=%s",prog);
  addenv(&local_2240,"PATH_TRANSLATED=%s",prog);
  pcVar17 = "on";
  if (nc->ssl == (SSL *)0x0) {
    pcVar17 = "off";
  }
  addenv(&local_2240,"HTTPS=%s",pcVar17);
  pmVar7 = mg_get_http_header(hm,"Content-Type");
  if (pmVar7 != (mg_str *)0x0) {
    addenv(&local_2240,"CONTENT_TYPE=%.*s",(ulong)(uint)pmVar7->len,pmVar7->p);
  }
  sVar15 = (hm->query_string).len;
  if (sVar15 != 0) {
    addenv(&local_2240,"QUERY_STRING=%.*s",sVar15,(hm->query_string).p);
  }
  local_2650 = opts;
  local_2648 = nc;
  local_2640 = prog;
  pmVar7 = mg_get_http_header(hm,"Content-Length");
  if (pmVar7 != (mg_str *)0x0) {
    addenv(&local_2240,"CONTENT_LENGTH=%.*s",(ulong)(uint)pmVar7->len,pmVar7->p);
  }
  addenv2(&local_2240,"PATH");
  addenv2(&local_2240,"TMP");
  addenv2(&local_2240,"TEMP");
  addenv2(&local_2240,"TMPDIR");
  addenv2(&local_2240,"PERLLIB");
  addenv2(&local_2240,"MONGOOSE_CGI");
  addenv2(&local_2240,"LD_LIBRARY_PATH");
  sVar15 = hm->header_names[0].len;
  if (sVar15 != 0) {
    pmVar7 = hm->header_names;
    lVar10 = 0;
LAB_0010f4bb:
    pbVar8 = (byte *)addenv(&local_2240,"HTTP_%.*s=%.*s",sVar15,pmVar7->p,
                            (ulong)(uint)hm->header_values[lVar10].len,hm->header_values[lVar10].p);
    do {
      bVar1 = *pbVar8;
      uVar16 = (ulong)bVar1;
      if (bVar1 == 0x2d) {
        *pbVar8 = 0x5f;
        uVar16 = 0x5f;
      }
      else if ((bVar1 == 0) || (bVar1 == 0x3d)) goto LAB_0010f51a;
      pp_Var9 = __ctype_toupper_loc();
      *pbVar8 = *(byte *)(*pp_Var9 + uVar16);
      pbVar8 = pbVar8 + 1;
    } while( true );
  }
LAB_0010f532:
  pcVar17 = local_2640;
  lVar10 = (long)local_2240.nvars;
  local_2240.nvars = local_2240.nvars + 1;
  local_2240.vars[lVar10] = (char *)0x0;
  lVar10 = (long)local_2240.len;
  local_2240.len = local_2240.len + 1;
  local_2240.buf[lVar10] = '\0';
  pcVar11 = strrchr(local_2640,0x2f);
  if (pcVar11 == (char *)0x0) {
    local_2438[0]._0_2_ = 0x2e;
  }
  else {
    snprintf((char *)local_2438,500,"%.*s",(ulong)(uint)((int)pcVar11 - (int)pcVar17),pcVar17);
    pcVar17 = pcVar11 + 1;
  }
  nc_00 = local_2648;
  pmVar4 = local_2650;
  do {
    mg_socketpair(&local_2660,1);
  } while (local_2660 == -1);
  free_http_proto_data(nc_00);
  pvVar12 = calloc(1,0x30);
  if (pvVar12 == (void *)0x0) {
    mg_send_head(nc_00,500,0,(char *)0x0);
    goto LAB_0010f6d3;
  }
  pcVar11 = pmVar4->cgi_interpreter;
  _Var5 = fork();
  if (_Var5 == 0) {
    chdir((char *)local_2438);
    dup2(local_265c,0);
    dup2(local_265c,1);
    close(local_265c);
    __sysv_signal(0x11,(__sighandler_t)0x0);
    if (pcVar11 == (char *)0x0) {
      execle(pcVar17,pcVar17,0,local_2240.vars);
      pcVar11 = "";
    }
    else {
      execle(pcVar11,pcVar11,pcVar17,0,local_2240.vars);
      local_2658 = " ";
    }
    piVar13 = __errno_location();
    pcVar6 = strerror(*piVar13);
    snprintf((char *)local_2638,500,"Status: 500\r\n\r\n500 Server Error: %s%s%s: %s",pcVar11,
             local_2658,pcVar17,pcVar6);
    __n = strlen((char *)local_2638);
    send(1,local_2638,__n,0);
    exit(1);
  }
  sVar15 = (hm->body).len;
  sVar2 = (hm->message).len;
  sVar3 = (nc_00->recv_mbuf).len;
  *(undefined4 *)((long)pvVar12 + 0x28) = 3;
  local_2638[0] = 0;
  local_2638[1] = 0;
  local_2638[2] = 0;
  local_2638[3] = 0;
  local_2638[4] = 0;
  local_2638[5] = 0;
  opts_00.error_string = (char **)0x0;
  opts_00.user_data = (void *)0x0;
  opts_00.flags = 0;
  opts_00._12_4_ = 0;
  nc_01 = mg_add_sock_opt(nc_00->mgr,local_2660,cgi_ev_handler,opts_00);
  *(mg_connection **)((long)pvVar12 + 0x20) = nc_01;
  nc_01->user_data = nc_00;
  nc_01->proto_data = pvVar12;
  pbVar8 = (byte *)((long)&nc_00->flags + 2);
  *pbVar8 = *pbVar8 | 0x10;
  uVar16 = sVar3 + (sVar15 - sVar2);
  if (uVar16 == 0) {
LAB_0010f6ab:
    uVar14 = (nc_00->recv_mbuf).len;
  }
  else {
    uVar14 = (nc_00->recv_mbuf).len;
    if (uVar16 < uVar14) {
      mg_send(nc_01,(hm->body).p,(int)uVar16);
      goto LAB_0010f6ab;
    }
  }
  if (uVar14 != 0) {
    (nc_00->recv_mbuf).len = 0;
  }
LAB_0010f6d3:
  close(local_265c);
  return;
LAB_0010f51a:
  pmVar7 = hm->header_names + lVar10 + 1;
  sVar15 = hm->header_names[lVar10 + 1].len;
  lVar10 = lVar10 + 1;
  if (sVar15 == 0) goto LAB_0010f532;
  goto LAB_0010f4bb;
}

Assistant:

static void handle_cgi(struct mg_connection *nc, const char *prog,
                       const struct http_message *hm,
                       const struct mg_serve_http_opts *opts) {
    struct proto_data_http *dp;
    struct cgi_env_block blk;
    char dir[MAX_PATH_SIZE];
    const char *p;
    sock_t fds[2];

    prepare_cgi_environment(nc, prog, hm, opts, &blk);
    /*
   * CGI must be executed in its own directory. 'dir' must point to the
   * directory containing executable program, 'p' must point to the
   * executable program name relative to 'dir'.
   */
    if ((p = strrchr(prog, '/')) == NULL) {
        snprintf(dir, sizeof(dir), "%s", ".");
    } else {
        snprintf(dir, sizeof(dir), "%.*s", (int) (p - prog), prog);
        prog = p + 1;
    }

    /*
   * Try to create socketpair in a loop until success. mg_socketpair()
   * can be interrupted by a signal and fail.
   * TODO(lsm): use sigaction to restart interrupted syscall
   */
    do {
        mg_socketpair(fds, SOCK_STREAM);
    } while (fds[0] == INVALID_SOCKET);

    free_http_proto_data(nc);
    if ((dp = (struct proto_data_http *) MG_CALLOC(1, sizeof(*dp))) == NULL) {
        send_http_error(nc, 500, "OOM"); /* LCOV_EXCL_LINE */
    } else if (start_process(opts->cgi_interpreter, prog, blk.buf, blk.vars, dir,
                             fds[1]) != 0) {
        size_t n = nc->recv_mbuf.len - (hm->message.len - hm->body.len);
        dp->type = DATA_CGI;
        dp->cgi_nc = mg_add_sock(nc->mgr, fds[0], cgi_ev_handler);
        dp->cgi_nc->user_data = nc;
        dp->cgi_nc->proto_data = dp;
        nc->flags |= MG_F_USER_1;
        /* Push POST data to the CGI */
        if (n > 0 && n < nc->recv_mbuf.len) {
            mg_send(dp->cgi_nc, hm->body.p, n);
        }
        mbuf_remove(&nc->recv_mbuf, nc->recv_mbuf.len);
    } else {
        closesocket(fds[0]);
        send_http_error(nc, 500, "CGI failure");
    }

#ifndef _WIN32
    closesocket(fds[1]); /* On Windows, CGI stdio thread closes that socket */
#endif
}